

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

optional<QFont::Tag> QFont::Tag::fromString(QAnyStringView view)

{
  bool bVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  Tag maybeTag;
  Tag *in_stack_ffffffffffffffa8;
  optional<QFont::Tag> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  Tag in_stack_ffffffffffffffbc;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QAnyStringView local_20;
  _Optional_payload_base<QFont::Tag> in_stack_fffffffffffffff0;
  QAnyStringView *this;
  
  this = *(QAnyStringView **)(in_FS_OFFSET + 0x28);
  qVar2 = QAnyStringView::size(&local_20);
  if (qVar2 == 4) {
    QAnyStringView::visit<QFont::Tag::fromString(QAnyStringView)::__0>
              (this,(anon_class_1_0_00000001 *)in_stack_fffffffffffffff0);
    bVar1 = isValid((Tag *)&stack0xffffffffffffffbc);
    if (bVar1) {
      std::optional<QFont::Tag>::optional<const_QFont::Tag_&,_true>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      std::optional<QFont::Tag>::optional((optional<QFont::Tag> *)&stack0xfffffffffffffff0);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc.m_value,in_stack_ffffffffffffffb8),
               (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(char *)in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (&stack0xffffffffffffffc0,"The tag name must be exactly 4 characters long!");
    std::optional<QFont::Tag>::optional((optional<QFont::Tag> *)&stack0xfffffffffffffff0);
  }
  if (*(QAnyStringView **)(in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return (optional<QFont::Tag>)in_stack_fffffffffffffff0;
}

Assistant:

std::optional<QFont::Tag> QFont::Tag::fromString(QAnyStringView view) noexcept
{
    if (view.size() != 4) {
        qWarning("The tag name must be exactly 4 characters long!");
        return std::nullopt;
    }
    const QFont::Tag maybeTag = view.visit([](auto view) {
        using CharType = decltype(view.at(0));
        if constexpr (std::is_same_v<CharType, char>) {
            const char bytes[5] = { view.at(0), view.at(1), view.at(2), view.at(3), 0 };
            return Tag(bytes);
        } else {
            const char bytes[5] = { view.at(0).toLatin1(), view.at(1).toLatin1(),
                                    view.at(2).toLatin1(), view.at(3).toLatin1(), 0 };
            return Tag(bytes);
        }
    });
    return maybeTag.isValid() ? std::optional<Tag>(maybeTag) : std::nullopt;
}